

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O1

int search_numerative_class(char **list,NJDNode *node)

{
  int iVar1;
  char *__s1;
  char **ppcVar2;
  char *__s1_00;
  
  __s1 = NJDNode_get_string(node);
  iVar1 = strcmp(__s1,"*");
  if ((iVar1 != 0) && (__s1_00 = *list, __s1_00 != (char *)0x0)) {
    ppcVar2 = list + 1;
    do {
      iVar1 = strcmp(__s1_00,__s1);
      if (iVar1 == 0) {
        return 1;
      }
      __s1_00 = *ppcVar2;
      ppcVar2 = ppcVar2 + 1;
    } while (__s1_00 != (char *)0x0);
  }
  return 0;
}

Assistant:

static int search_numerative_class(const char *list[], NJDNode * node)
{
   int i;
   const char *str = NJDNode_get_string(node);

   if (strcmp(str, "*") == 0)
      return 0;
   for (i = 0; list[i] != NULL; i++) {
      if (strcmp(list[i], str) == 0)
         return 1;
   }
   return 0;
}